

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiLineEntry.cpp
# Opt level: O1

void __thiscall
cursespp::MultiLineEntry::MultiLineEntry(MultiLineEntry *this,string *value,Color *attrs)

{
  (this->super_IEntry)._vptr_IEntry = (_func_int **)&PTR__MultiLineEntry_001a9750;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attrs).value = -1;
  std::__cxx11::string::_M_assign((string *)&this->value);
  this->charCount = value->_M_string_length;
  this->width = 0xffffffffffffffff;
  (this->attrs).value = attrs->value;
  return;
}

Assistant:

MultiLineEntry::MultiLineEntry(const std::string& value, Color attrs) {
    this->value = value;
    this->charCount = value.size();
    this->width = -1;
    this->attrs = attrs;
}